

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

Value * DumpRegExToJsonArray
                  (Value *__return_storage_ptr__,
                  vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *values)

{
  pointer ppVar1;
  Value *pVVar2;
  Value *extraout_RAX;
  Value *extraout_RAX_00;
  pointer ppVar3;
  Value VStack_48;
  
  Json::Value::Value(__return_storage_ptr__,arrayValue);
  ppVar1 = (values->
           super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pVVar2 = extraout_RAX;
  for (ppVar3 = (values->
                super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1) {
    Json::Value::Value(&VStack_48,&ppVar3->second);
    Json::Value::append(__return_storage_ptr__,&VStack_48);
    Json::Value::~Value(&VStack_48);
    pVVar2 = extraout_RAX_00;
  }
  return pVVar2;
}

Assistant:

static Json::Value DumpRegExToJsonArray(
  const std::vector<std::pair<cmsys::RegularExpression, std::string>>& values)
{
  Json::Value jsonArray = Json::arrayValue;
  for (auto& it : values) {
    jsonArray.append(it.second);
  }
  return jsonArray;
}